

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoding_backend_init_file__flac
                    (void *pUserData,char *pFilePath,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_data_source **ppBackend)

{
  ma_decoding_backend_config pFlac_00;
  char *in_RCX;
  ma_decoding_backend_config *in_R8;
  ma_flac *pFlac;
  ma_result result;
  ma_allocation_callbacks *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 local_4;
  
  pFlac_00 = (ma_decoding_backend_config)
             ma_malloc((size_t)in_stack_ffffffffffffffb8,(ma_allocation_callbacks *)0x2696bc);
  if (pFlac_00 == (ma_decoding_backend_config)0x0) {
    local_4 = MA_OUT_OF_MEMORY;
  }
  else {
    local_4 = ma_flac_init_file(in_RCX,in_R8,
                                (ma_allocation_callbacks *)
                                CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                (ma_flac *)pFlac_00);
    if (local_4 == MA_SUCCESS) {
      *in_R8 = pFlac_00;
      local_4 = MA_SUCCESS;
    }
    else {
      ma_free((void *)pFlac_00,in_stack_ffffffffffffffb8);
    }
  }
  return local_4;
}

Assistant:

static ma_result ma_decoding_backend_init_file__flac(void* pUserData, const char* pFilePath, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_data_source** ppBackend)
{
    ma_result result;
    ma_flac* pFlac;

    (void)pUserData;    /* For now not using pUserData, but once we start storing the vorbis decoder state within the ma_decoder structure this will be set to the decoder so we can avoid a malloc. */

    /* For now we're just allocating the decoder backend on the heap. */
    pFlac = (ma_flac*)ma_malloc(sizeof(*pFlac), pAllocationCallbacks);
    if (pFlac == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    result = ma_flac_init_file(pFilePath, pConfig, pAllocationCallbacks, pFlac);
    if (result != MA_SUCCESS) {
        ma_free(pFlac, pAllocationCallbacks);
        return result;
    }

    *ppBackend = pFlac;

    return MA_SUCCESS;
}